

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

void CopyTempOutputBuffersToHostOutputBuffers(PaUtilBufferProcessor *bp)

{
  unsigned_long uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  void *pvVar6;
  PaUtilChannelDescriptor *pPVar7;
  ulong uVar8;
  uint local_3c;
  
  uVar2 = bp->framesInTempOutputBuffer;
  if (uVar2 != 0) {
    uVar1 = bp->hostOutputFrameCount[0];
    do {
      if (uVar1 + bp->hostOutputFrameCount[1] == 0) {
        return;
      }
      uVar8 = bp->hostOutputFrameCount[1];
      if (uVar1 != 0) {
        uVar8 = uVar1;
      }
      if (uVar2 <= uVar8) {
        uVar8 = uVar2;
      }
      uVar4 = bp->bytesPerUserOutputSample;
      if (bp->userOutputIsInterleaved == 0) {
        lVar5 = (bp->framesPerUserBuffer - uVar2) * (ulong)uVar4;
        uVar4 = (int)bp->framesPerUserBuffer * uVar4;
        uVar3 = bp->outputChannelCount;
        local_3c = 1;
      }
      else {
        uVar3 = bp->outputChannelCount;
        lVar5 = (bp->framesPerUserBuffer - uVar2) * (ulong)(uVar3 * uVar4);
        local_3c = uVar3;
      }
      if (uVar3 != 0) {
        pPVar7 = bp->hostOutputChannels[uVar1 == 0];
        pvVar6 = (void *)(lVar5 + (long)bp->tempOutputBuffer);
        uVar2 = 0;
        do {
          if (pPVar7->data == (void *)0x0) {
            __assert_fail("hostOutputChannels[i].data != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_process.c"
                          ,0x4e9,
                          "void CopyTempOutputBuffersToHostOutputBuffers(PaUtilBufferProcessor *)");
          }
          (*bp->outputConverter)
                    (pPVar7->data,pPVar7->stride,pvVar6,local_3c,(uint)uVar8,&bp->ditherGenerator);
          pvVar6 = (void *)((long)pvVar6 + (ulong)uVar4);
          pPVar7->data = (void *)((long)pPVar7->data +
                                 (ulong)(pPVar7->stride * (uint)uVar8 * bp->bytesPerHostOutputSample
                                        ));
          uVar2 = uVar2 + 1;
          pPVar7 = pPVar7 + 1;
        } while (uVar2 < bp->outputChannelCount);
        uVar1 = bp->hostOutputFrameCount[0];
      }
      uVar2 = uVar8 & 0xffffffff;
      if (uVar1 == 0) {
        bp->hostOutputFrameCount[1] = bp->hostOutputFrameCount[1] - uVar2;
        uVar1 = 0;
      }
      else {
        uVar1 = uVar1 - uVar2;
        bp->hostOutputFrameCount[0] = uVar1;
      }
      uVar2 = bp->framesInTempOutputBuffer - uVar2;
      bp->framesInTempOutputBuffer = uVar2;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

static void CopyTempOutputBuffersToHostOutputBuffers( PaUtilBufferProcessor *bp)
{
    unsigned long maxFramesToCopy;
    PaUtilChannelDescriptor *hostOutputChannels;
    unsigned int frameCount;
    unsigned char *srcBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;

    /* copy frames from user to host output buffers */
    while( bp->framesInTempOutputBuffer > 0 &&
            ((bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]) > 0) )
    {
        maxFramesToCopy = bp->framesInTempOutputBuffer;

        /* select the output buffer set (1st or 2nd) */
        if( bp->hostOutputFrameCount[0] > 0 )
        {
            hostOutputChannels = bp->hostOutputChannels[0];
            frameCount = PA_MIN_( bp->hostOutputFrameCount[0], maxFramesToCopy );
        }
        else
        {
            hostOutputChannels = bp->hostOutputChannels[1];
            frameCount = PA_MIN_( bp->hostOutputFrameCount[1], maxFramesToCopy );
        }

        if( bp->userOutputIsInterleaved )
        {
            srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                    bp->bytesPerUserOutputSample * bp->outputChannelCount *
                    (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

            srcSampleStrideSamples = bp->outputChannelCount;
            srcChannelStrideBytes = bp->bytesPerUserOutputSample;
        }
        else /* user output is not interleaved */
        {
            srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                    bp->bytesPerUserOutputSample *
                    (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

            srcSampleStrideSamples = 1;
            srcChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
        }

        for( i=0; i<bp->outputChannelCount; ++i )
        {
            assert( hostOutputChannels[i].data != NULL );
            bp->outputConverter(    hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    srcBytePtr, srcSampleStrideSamples,
                                    frameCount, &bp->ditherGenerator );

            srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

            /* advance dest ptr for next iteration */
            hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                    frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
        }

        if( bp->hostOutputFrameCount[0] > 0 )
            bp->hostOutputFrameCount[0] -= frameCount;
        else
            bp->hostOutputFrameCount[1] -= frameCount;

        bp->framesInTempOutputBuffer -= frameCount;
    }
}